

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

bool __thiscall google::protobuf::util::Status::operator==(Status *this,Status *x)

{
  __type _Var1;
  
  if (this->error_code_ == x->error_code_) {
    _Var1 = std::operator==(&this->error_message_,&x->error_message_);
    return _Var1;
  }
  return false;
}

Assistant:

bool Status::operator==(const Status& x) const {
  return error_code_ == x.error_code_ &&
      error_message_ == x.error_message_;
}